

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
::reactive_socket_accept_op
          (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,state_type state,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,tcp *protocol,
          endpoint *peer_endpoint,function<void_(const_std::error_code_&)> *handler,
          any_io_executor *io_ex)

{
  undefined1 in_CL;
  undefined4 in_EDX;
  undefined8 in_RSI;
  error_code *in_RDI;
  tcp *in_R8;
  reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  *unaff_retaddr;
  function<void_(const_std::error_code_&)> *in_stack_00000008;
  endpoint *in_stack_00000010;
  func_type in_stack_00000018;
  code *this_00;
  undefined3 in_stack_ffffffffffffffe8;
  
  this_00 = do_complete;
  reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  ::reactive_socket_accept_op_base
            (unaff_retaddr,in_RDI,(socket_type)((ulong)in_RSI >> 0x20),
             (state_type)((ulong)in_RSI >> 0x18),
             (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)
             CONCAT44(in_EDX,CONCAT13(in_CL,in_stack_ffffffffffffffe8)),in_R8,in_stack_00000010,
             in_stack_00000018);
  std::function<void_(const_std::error_code_&)>::function
            ((function<void_(const_std::error_code_&)> *)this_00,in_stack_00000008);
  handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>::
  handler_work((handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>
                *)this_00,in_stack_00000008,(any_io_executor *)0x7dcdcf);
  return;
}

Assistant:

reactive_socket_accept_op(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state, Socket& peer,
      const Protocol& protocol, typename Protocol::endpoint* peer_endpoint,
      Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_accept_op_base<Socket, Protocol>(
        success_ec, socket, state, peer, protocol, peer_endpoint,
        &reactive_socket_accept_op::do_complete),
      handler_(static_cast<Handler&&>(handler)),
      work_(handler_, io_ex)
  {
  }